

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

shared_ptr<rcg::Device> __thiscall
rcg::Interface::getDevice(Interface *this,char *devid,uint64_t timeout)

{
  ulong uVar1;
  bool bVar2;
  GC_ERROR GVar3;
  size_type sVar4;
  element_type *this_00;
  Device *this_01;
  ostream *poVar5;
  element_type *peVar6;
  shared_ptr<rcg::Device> *this_02;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Device *in_RSI;
  element_type *in_RDI;
  shared_ptr<rcg::Device> sVar7;
  GC_ERROR err;
  DEV_HANDLE dev;
  shared_ptr<rcg::Device> p;
  size_t i;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> list;
  shared_ptr<rcg::Device> *ret;
  uint64_t in_stack_00000330;
  Interface *in_stack_00000338;
  Device *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffeb0;
  bool local_13a;
  bool local_129;
  char *in_stack_ffffffffffffff08;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffff10;
  shared_ptr<rcg::Interface> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  DEV_HANDLE local_d8;
  int local_cc;
  byte local_b1;
  string local_b0 [39];
  byte local_89;
  string local_88 [48];
  __shared_ptr local_58 [16];
  ulong local_48;
  undefined1 local_39;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_38;
  char *local_18;
  
  local_18 = in_RDX;
  getDevices(in_stack_00000338,in_stack_00000330);
  local_39 = 0;
  std::shared_ptr<rcg::Device>::shared_ptr((shared_ptr<rcg::Device> *)0x114a08);
  for (local_48 = 0; uVar1 = local_48,
      sVar4 = std::
              vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
              size(&local_38), uVar1 < sVar4; local_48 = local_48 + 1) {
    std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
    operator[](&local_38,local_48);
    std::shared_ptr<rcg::Device>::shared_ptr
              ((shared_ptr<rcg::Device> *)in_stack_fffffffffffffea0,
               (shared_ptr<rcg::Device> *)in_stack_fffffffffffffe98);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_58);
    local_89 = 0;
    local_b1 = 0;
    local_129 = false;
    if (bVar2) {
      this_00 = std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x114aa0);
      this_01 = (Device *)Device::getID_abi_cxx11_(this_00);
      bVar2 = std::operator==(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      local_13a = true;
      if (!bVar2) {
        std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x114ae9);
        Device::getDisplayName_abi_cxx11_(in_RSI);
        local_89 = 1;
        bVar2 = std::operator==(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
        local_13a = true;
        if (!bVar2) {
          std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x114b3c);
          Device::getSerialNumber_abi_cxx11_(this_01);
          local_b1 = 1;
          local_13a = std::operator==(in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
        }
      }
      local_129 = local_13a;
    }
    if ((local_b1 & 1) != 0) {
      std::__cxx11::string::~string(local_b0);
    }
    if ((local_89 & 1) != 0) {
      std::__cxx11::string::~string(local_88);
    }
    if (local_129 == false) {
LAB_00114cee:
      local_cc = 0;
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      if (!bVar2) {
        std::shared_ptr<rcg::Device>::operator=
                  ((shared_ptr<rcg::Device> *)in_stack_fffffffffffffea0,
                   (shared_ptr<rcg::Device> *)in_stack_fffffffffffffe98);
        goto LAB_00114cee;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "There is more than one device with ID, serial number or user defined name: "
                              );
      in_stack_fffffffffffffeb0 = std::operator<<(poVar5,local_18);
      std::ostream::operator<<(in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<rcg::Device>::shared_ptr
                ((shared_ptr<rcg::Device> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::shared_ptr<rcg::Device>::operator=
                ((shared_ptr<rcg::Device> *)in_stack_fffffffffffffea0,
                 (shared_ptr<rcg::Device> *)in_stack_fffffffffffffe98);
      std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x114c53);
      local_cc = 2;
    }
    std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x114d06);
    if (local_cc != 0) break;
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if ((!bVar2) && (in_RSI->dev != (void *)0x0)) {
    local_d8 = (DEV_HANDLE)0x0;
    peVar6 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x114d81);
    GVar3 = (*peVar6->IFOpenDevice)(in_RSI->dev,local_18,2,&local_d8);
    if (GVar3 == 0) {
      peVar6 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x114dd4);
      (*peVar6->DevClose)(local_d8);
    }
    if (((GVar3 == 0) || (GVar3 == -0x3ec)) || (GVar3 == -0x3ed)) {
      this_02 = (shared_ptr<rcg::Device> *)operator_new(0x130);
      std::enable_shared_from_this<rcg::Interface>::shared_from_this
                ((enable_shared_from_this<rcg::Interface> *)in_stack_fffffffffffffe98);
      Device::Device((Device *)CONCAT44(GVar3,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::shared_ptr<rcg::Device>::shared_ptr<rcg::Device,void>(this_02,in_stack_fffffffffffffe98);
      std::shared_ptr<rcg::Device>::operator=
                (this_02,(shared_ptr<rcg::Device> *)in_stack_fffffffffffffe98);
      std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x114ea2);
      std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x114eac);
    }
  }
  local_39 = 1;
  local_cc = 1;
  std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::~vector
            ((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> *
             )in_stack_fffffffffffffeb0);
  sVar7.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<rcg::Device>)sVar7.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Device> Interface::getDevice(const char *devid, uint64_t timeout)
{
  // get list of all devices

  std::vector<std::shared_ptr<Device> > list=getDevices(timeout);

  // find requested device by ID or user defined name

  std::shared_ptr<Device> ret;

  for (size_t i=0; i<list.size(); i++)
  {
    std::shared_ptr<Device> p=list[i];

    if (p && (p->getID() == devid || p->getDisplayName() == devid ||
              p->getSerialNumber() == devid))
    {
      if (ret)
      {
        std::cerr << "There is more than one device with ID, serial number or user defined name: "
                  << devid << std::endl;
        ret=0;
        break;
      }

      ret=p;
    }
  }

  if (!ret && ifh != 0)
  {
    // try to open the device in a last attempt to check if the producer is
    // able to find it

    GenTL::DEV_HANDLE dev=0;

    GenTL::GC_ERROR err=gentl->IFOpenDevice(ifh, devid, GenTL::DEVICE_ACCESS_READONLY, &dev);

    if (err == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DevClose(dev);
    }

    if (err == GenTL::GC_ERR_SUCCESS || err == GenTL::GC_ERR_RESOURCE_IN_USE ||
        err == GenTL::GC_ERR_ACCESS_DENIED)
    {
      ret=std::shared_ptr<Device>(new Device(shared_from_this(), gentl, devid));
    }
  }

  return ret;
}